

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::DriveStrengthSyntax::setChild
          (DriveStrengthSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_015b7e90 + *(int *)(&DAT_015b7e90 + in_RSI * 4)))();
  return;
}

Assistant:

void DriveStrengthSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: strength0 = child.token(); return;
        case 2: comma = child.token(); return;
        case 3: strength1 = child.token(); return;
        case 4: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}